

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.pb.cc
# Opt level: O3

char * __thiscall
google::protobuf::compiler::CodeGeneratorRequest::_InternalParse
          (CodeGeneratorRequest *this,char *ptr,ParseContext *ctx)

{
  byte bVar1;
  int iVar2;
  ulong uVar3;
  internal *piVar4;
  char *size;
  bool bVar5;
  string *psVar6;
  FileDescriptorProto *obj;
  MessageLite *msg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *obj_00;
  Version *msg_00;
  uint uVar7;
  Rep *pRVar9;
  undefined8 *puVar10;
  UnknownFieldSet *unknown;
  byte *pbVar11;
  Arena *arena;
  char cVar12;
  uint res;
  StringPiece str;
  StringPiece str_00;
  pair<const_char_*,_unsigned_int> pVar13;
  byte *local_48;
  InternalMetadata *local_40;
  ArenaStringPtr *local_38;
  char *pcVar8;
  
  local_48 = (byte *)ptr;
  bVar5 = internal::EpsCopyInputStream::DoneWithCheck
                    (&ctx->super_EpsCopyInputStream,(char **)&local_48,ctx->group_depth_);
  if (!bVar5) {
    local_40 = &(this->super_Message).super_MessageLite._internal_metadata_;
    local_38 = &this->parameter_;
    do {
      bVar1 = *local_48;
      res = (uint)bVar1;
      pbVar11 = local_48 + 1;
      if ((char)bVar1 < '\0') {
        res = ((uint)bVar1 + (uint)*pbVar11 * 0x80) - 0x80;
        if ((char)*pbVar11 < '\0') {
          pVar13 = internal::ReadTagFallback((char *)local_48,res);
          pbVar11 = (byte *)pVar13.first;
          res = pVar13.second;
        }
        else {
          pbVar11 = local_48 + 2;
        }
      }
      uVar7 = res >> 3;
      pcVar8 = (char *)(ulong)uVar7;
      cVar12 = (char)res;
      local_48 = pbVar11;
      if (uVar7 < 3) {
        if (uVar7 == 1) {
          if (cVar12 == '\n') {
            local_48 = pbVar11 + -1;
            do {
              local_48 = local_48 + 1;
              pRVar9 = (this->file_to_generate_).super_RepeatedPtrFieldBase.rep_;
              if (pRVar9 == (Rep *)0x0) {
LAB_0028244e:
                obj_00 = Arena::Create<std::__cxx11::string>
                                   ((this->file_to_generate_).super_RepeatedPtrFieldBase.arena_);
                psVar6 = (string *)
                         internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                                   (&(this->file_to_generate_).super_RepeatedPtrFieldBase,obj_00);
              }
              else {
                iVar2 = (this->file_to_generate_).super_RepeatedPtrFieldBase.current_size_;
                if (pRVar9->allocated_size <= iVar2) goto LAB_0028244e;
                (this->file_to_generate_).super_RepeatedPtrFieldBase.current_size_ = iVar2 + 1;
                psVar6 = (string *)pRVar9->elements[iVar2];
              }
              local_48 = (byte *)internal::InlineGreedyStringParser(psVar6,(char *)local_48,ctx);
              piVar4 = (internal *)(psVar6->_M_dataplus)._M_p;
              pcVar8 = (char *)psVar6->_M_string_length;
              if ((long)pcVar8 < 0) {
                stringpiece_internal::StringPiece::LogFatalSizeTooBig
                          ((size_t)pcVar8,"string length exceeds max size");
              }
              str_00.length_ =
                   (size_type)"google.protobuf.compiler.CodeGeneratorRequest.file_to_generate";
              str_00.ptr_ = pcVar8;
              internal::VerifyUTF8(piVar4,str_00,(char *)pRVar9);
              if (local_48 == (byte *)0x0) {
                return (char *)0x0;
              }
            } while ((local_48 < (ctx->super_EpsCopyInputStream).limit_end_) && (*local_48 == 10));
            goto LAB_00282559;
          }
        }
        else if ((uVar7 == 2) && (cVar12 == '\x12')) {
          *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 1;
          uVar3 = (this->super_Message).super_MessageLite._internal_metadata_.ptr_;
          puVar10 = (undefined8 *)(uVar3 & 0xfffffffffffffffc);
          if ((uVar3 & 1) != 0) {
            puVar10 = (undefined8 *)*puVar10;
          }
          psVar6 = internal::ArenaStringPtr::Mutable_abi_cxx11_(local_38,puVar10);
          local_48 = (byte *)internal::InlineGreedyStringParser(psVar6,(char *)local_48,ctx);
          piVar4 = (internal *)(psVar6->_M_dataplus)._M_p;
          size = (char *)psVar6->_M_string_length;
          if ((long)size < 0) {
            stringpiece_internal::StringPiece::LogFatalSizeTooBig
                      ((size_t)size,"string length exceeds max size");
          }
          str.length_ = (size_type)"google.protobuf.compiler.CodeGeneratorRequest.parameter";
          str.ptr_ = size;
          internal::VerifyUTF8(piVar4,str,pcVar8);
          goto joined_r0x00282386;
        }
LAB_00282518:
        if ((res == 0) || ((res & 7) == 4)) {
          if (pbVar11 == (byte *)0x0) {
            return (char *)0x0;
          }
          (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = res - 1;
          return (char *)pbVar11;
        }
        if ((local_40->ptr_ & 1U) == 0) {
          unknown = internal::InternalMetadata::
                    mutable_unknown_fields_slow<google::protobuf::UnknownFieldSet>(local_40);
        }
        else {
          unknown = (UnknownFieldSet *)((local_40->ptr_ & 0xfffffffffffffffcU) + 8);
        }
        local_48 = (byte *)internal::UnknownFieldParse((ulong)res,unknown,(char *)local_48,ctx);
joined_r0x00282386:
        if (local_48 == (byte *)0x0) {
          return (char *)0x0;
        }
      }
      else {
        if (uVar7 == 3) {
          if (cVar12 != '\x1a') goto LAB_00282518;
          *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 2;
          msg_00 = this->compiler_version_;
          if (msg_00 == (Version *)0x0) {
            arena = (Arena *)(local_40->ptr_ & 0xfffffffffffffffc);
            if ((local_40->ptr_ & 1U) != 0) {
              arena = *(Arena **)arena;
            }
            msg_00 = Arena::CreateMaybeMessage<google::protobuf::compiler::Version>(arena);
            this->compiler_version_ = msg_00;
          }
          local_48 = (byte *)internal::ParseContext::ParseMessage
                                       (ctx,(MessageLite *)msg_00,(char *)local_48);
          goto joined_r0x00282386;
        }
        if ((uVar7 != 0xf) || (cVar12 != 'z')) goto LAB_00282518;
        local_48 = pbVar11 + -1;
        do {
          local_48 = local_48 + 1;
          pRVar9 = (this->proto_file_).super_RepeatedPtrFieldBase.rep_;
          if (pRVar9 == (Rep *)0x0) {
LAB_002823d6:
            obj = Arena::CreateMaybeMessage<google::protobuf::FileDescriptorProto>
                            ((this->proto_file_).super_RepeatedPtrFieldBase.arena_);
            msg = (MessageLite *)
                  internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                            (&(this->proto_file_).super_RepeatedPtrFieldBase,obj);
          }
          else {
            iVar2 = (this->proto_file_).super_RepeatedPtrFieldBase.current_size_;
            if (pRVar9->allocated_size <= iVar2) goto LAB_002823d6;
            (this->proto_file_).super_RepeatedPtrFieldBase.current_size_ = iVar2 + 1;
            msg = (MessageLite *)pRVar9->elements[iVar2];
          }
          local_48 = (byte *)internal::ParseContext::ParseMessage(ctx,msg,(char *)local_48);
          if (local_48 == (byte *)0x0) {
            return (char *)0x0;
          }
        } while ((local_48 < (ctx->super_EpsCopyInputStream).limit_end_) && (*local_48 == 0x7a));
      }
LAB_00282559:
      bVar5 = internal::EpsCopyInputStream::DoneWithCheck
                        (&ctx->super_EpsCopyInputStream,(char **)&local_48,ctx->group_depth_);
    } while (!bVar5);
  }
  return (char *)local_48;
}

Assistant:

const char* CodeGeneratorRequest::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  _Internal::HasBits has_bits{};
  while (!ctx->Done(&ptr)) {
    uint32_t tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    switch (tag >> 3) {
      // repeated string file_to_generate = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 10)) {
          ptr -= 1;
          do {
            ptr += 1;
            auto str = _internal_add_file_to_generate();
            ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
            #ifndef NDEBUG
            ::PROTOBUF_NAMESPACE_ID::internal::VerifyUTF8(str, "google.protobuf.compiler.CodeGeneratorRequest.file_to_generate");
            #endif  // !NDEBUG
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<10>(ptr));
        } else
          goto handle_unusual;
        continue;
      // optional string parameter = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 18)) {
          auto str = _internal_mutable_parameter();
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
          #ifndef NDEBUG
          ::PROTOBUF_NAMESPACE_ID::internal::VerifyUTF8(str, "google.protobuf.compiler.CodeGeneratorRequest.parameter");
          #endif  // !NDEBUG
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // optional .google.protobuf.compiler.Version compiler_version = 3;
      case 3:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 26)) {
          ptr = ctx->ParseMessage(_internal_mutable_compiler_version(), ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // repeated .google.protobuf.FileDescriptorProto proto_file = 15;
      case 15:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 122)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ctx->ParseMessage(_internal_add_proto_file(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<122>(ptr));
        } else
          goto handle_unusual;
        continue;
      default:
        goto handle_unusual;
    }  // switch
  handle_unusual:
    if ((tag == 0) || ((tag & 7) == 4)) {
      CHK_(ptr);
      ctx->SetLastTag(tag);
      goto message_done;
    }
    ptr = UnknownFieldParse(
        tag,
        _internal_metadata_.mutable_unknown_fields<::PROTOBUF_NAMESPACE_ID::UnknownFieldSet>(),
        ptr, ctx);
    CHK_(ptr != nullptr);
  }  // while
message_done:
  _has_bits_.Or(has_bits);
  return ptr;
failure:
  ptr = nullptr;
  goto message_done;
#undef CHK_
}